

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void __thiscall
image_transform_png_set_tRNS_to_alpha_set
          (void *this,transform_display *that,png_structp pp,png_infop pi)

{
  png_set_tRNS_to_alpha(pp);
  if ((that->this).has_tRNS != 0) {
    (that->this).is_transparent = 1;
  }
  (**(code **)(*(long *)((long)this + 0x20) + 0x30))(*(long *)((long)this + 0x20),that,pp,pi);
  return;
}

Assistant:

static void
image_transform_png_set_tRNS_to_alpha_set(const image_transform *this,
   transform_display *that, png_structp pp, png_infop pi)
{
   png_set_tRNS_to_alpha(pp);

   /* If there was a tRNS chunk that would get expanded and add an alpha
    * channel is_transparent must be updated:
    */
   if (that->this.has_tRNS)
      that->this.is_transparent = 1;

   this->next->set(this->next, that, pp, pi);
}